

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QByteArray,QRhiGles2::PipelineCacheData>::emplace<QRhiGles2::PipelineCacheData_const&>
          (QHash<QByteArray,QRhiGles2::PipelineCacheData> *this,QByteArray *key,
          PipelineCacheData *args)

{
  Data<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_> *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  Data<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_> *local_40;
  QArrayData *local_38;
  char *local_30;
  qsizetype local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_> **)this;
  if (pDVar1 == (Data<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_> *)0x0) {
    local_40 = (Data<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_> *)0x0;
LAB_00577fd0:
    pDVar1 = (Data<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_> *)0x0;
LAB_00577ff2:
    pDVar1 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_>::
             detached(pDVar1);
    *(Data<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_> **)this = pDVar1;
LAB_00577ffa:
    pVar2 = (piter)emplace_helper<QRhiGles2::PipelineCacheData_const&>(this,key,args);
    QHash<QByteArray,_QRhiGles2::PipelineCacheData>::~QHash
              ((QHash<QByteArray,_QRhiGles2::PipelineCacheData> *)&local_40);
  }
  else {
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      local_40 = pDVar1;
      if ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pDVar1 = *(Data<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_> **)this;
        if (pDVar1 == (Data<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_> *)0x0)
        goto LAB_00577fd0;
      }
      if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) goto LAB_00577ff2;
      goto LAB_00577ffa;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar2 = (piter)emplace_helper<QRhiGles2::PipelineCacheData_const&>(this,key,args);
        return (iterator)pVar2;
      }
      goto LAB_005780a2;
    }
    local_40 = (Data<QHashPrivate::Node<QByteArray,_QRhiGles2::PipelineCacheData>_> *)
               CONCAT44(local_40._4_4_,args->format);
    local_38 = &((args->data).d.d)->super_QArrayData;
    local_30 = (args->data).d.ptr;
    local_28 = (args->data).d.size;
    if (local_38 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_38->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_38->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pVar2 = (piter)QHash<QByteArray,_QRhiGles2::PipelineCacheData>::
                   emplace_helper<QRhiGles2::PipelineCacheData>
                             ((QHash<QByteArray,_QRhiGles2::PipelineCacheData> *)this,key,
                              (PipelineCacheData *)&local_40);
    if (local_38 != (QArrayData *)0x0) {
      LOCK();
      (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_38,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
LAB_005780a2:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }